

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall Analyser::analyse_unary_expression(Analyser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ulong uVar3;
  pointer pTVar4;
  bool bVar5;
  _Storage *p_Var6;
  bool bVar7;
  string *psVar8;
  long *plVar9;
  mapped_type_conflict *pmVar10;
  long *plVar11;
  optional<Token> next;
  string identifier;
  _Arg __arg;
  any local_150;
  undefined1 local_140 [32];
  char local_120;
  undefined1 local_118 [32];
  bool local_f8;
  string local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  _Arg local_30;
  
  nextToken((optional<Token> *)local_118,this);
  if (local_f8 == false) {
    psVar8 = (string *)__cxa_allocate_exception(0x28);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing <expression>","");
    iVar2 = this->_currentLine;
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar8,local_50,local_50 + local_48);
    *(long *)(psVar8 + 0x20) = (long)iVar2;
    __cxa_throw(psVar8,&Error::typeinfo,Error::~Error);
  }
  if (local_118._0_4_ == MINUS_SIGN) {
    nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_118,
               (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    }
    bVar5 = true;
  }
  else {
    if (local_118._0_4_ == PLUS_SIGN) {
      nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)local_118,
                 (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
      if (local_120 == '\x01') {
        std::_Optional_payload_base<Token>::_M_destroy
                  ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value
                  );
      }
    }
    bVar5 = false;
  }
  if (local_f8 == false) {
    psVar8 = (string *)__cxa_allocate_exception(0x28);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Missing <primary-expression>","");
    iVar2 = this->_currentLine;
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar8,local_70,local_70 + local_68);
    *(long *)(psVar8 + 0x20) = (long)iVar2;
    __cxa_throw(psVar8,&Error::typeinfo,Error::~Error);
  }
  paVar1 = &local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  if (local_118._0_4_ == UNSIGNED_INTEGER) {
    local_140._4_4_ = addConstant(this,(Token *)local_118);
    local_140._0_4_ = 6;
    local_140._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x100000000;
    addInstruction(this,(Instruction *)&((_Storage<Token,_false> *)local_140)->_M_value);
  }
  else if (local_118._0_4_ == IDENTIFIER) {
    local_150._M_storage._M_ptr = (void *)0x0;
    if ((_func_void__Op_any_ptr__Arg_ptr *)local_118._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0
       ) {
      local_150._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_30._M_obj = &local_150;
      (*(code *)local_118._8_8_)(_Op_clone,(any *)(local_118 + 8),&local_30);
    }
    plVar9 = (long *)std::__any_caster<std::__cxx11::string>(&local_150);
    if (plVar9 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    p_Var6 = &(((_Storage<Token,_false> *)local_140)->_M_value)._value._M_storage;
    plVar11 = plVar9 + 2;
    if ((_Storage *)*plVar9 == (_Storage *)plVar11) {
      local_140._16_8_ = *plVar11;
      local_140._24_8_ = plVar9[3];
      local_140._0_8_ = p_Var6;
    }
    else {
      local_140._16_8_ = *plVar11;
      local_140._0_8_ = (_Storage *)*plVar9;
    }
    local_140._8_8_ = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&local_f0,(string *)&((_Storage<Token,_false> *)local_140)->_M_value);
    if ((_Storage *)local_140._0_8_ != p_Var6) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if (local_150._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_150._M_manager)(_Op_destroy,&local_150,(_Arg *)0x0);
      local_150._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    bVar7 = loadVariable(this,&local_f0);
    if (bVar7) {
      local_140._0_8_ = (_Storage *)0x16;
      local_140._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&((_Storage<Token,_false> *)local_140)->_M_value);
    }
    else {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                ::operator[](&this->_functionRetType,&local_f0);
      if (*pmVar10 == 'v') {
        psVar8 = (string *)__cxa_allocate_exception(0x28);
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Can not call void function in < expression >","");
        iVar2 = this->_currentLine;
        *(string **)psVar8 = psVar8 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar8,local_b0,local_b0 + local_a8);
        *(long *)(psVar8 + 0x20) = (long)iVar2;
        __cxa_throw(psVar8,&Error::typeinfo,Error::~Error);
      }
      uVar3 = this->_offset;
      if (uVar3 != 0) {
        pTVar4 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar3 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5)) {
          this->_currentLine = (int32_t)pTVar4[uVar3 - 1]._lineNumber;
        }
        this->_offset = uVar3 - 1;
      }
      analyse_function_call(this);
    }
  }
  else {
    if (local_118._0_4_ != LEFT_BRACKET) {
      psVar8 = (string *)__cxa_allocate_exception(0x28);
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Missing <primary-expression>","");
      iVar2 = this->_currentLine;
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar8,local_d0,local_d0 + local_c8);
      *(long *)(psVar8 + 0x20) = (long)iVar2;
      __cxa_throw(psVar8,&Error::typeinfo,Error::~Error);
    }
    analyse_expression(this);
    nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_118,
               (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    }
    if ((local_f8 != true) || (local_118._0_4_ != RIGHT_BRACKET)) {
      psVar8 = (string *)__cxa_allocate_exception(0x28);
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Missing \')\'","");
      iVar2 = this->_currentLine;
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar8,local_90,local_90 + local_88);
      *(long *)(psVar8 + 0x20) = (long)iVar2;
      __cxa_throw(psVar8,&Error::typeinfo,Error::~Error);
    }
  }
  if (bVar5) {
    local_140._0_8_ = (_Storage *)0x18;
    local_140._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&((_Storage<Token,_false> *)local_140)->_M_value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if (local_f8 == true) {
    std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_118);
  }
  return;
}

Assistant:

void Analyser::analyse_unary_expression() {
	auto next = nextToken();
	if (!next.has_value()) {
		throw Error("Missing <expression>", _currentLine);
	}
	//<unary - operator>
	std::int32_t factor = 1;
	if (next.value().GetType() == TokenType::PLUS_SIGN) {
		next = nextToken();
	}
	else if (next.value().GetType() == TokenType::MINUS_SIGN) {
		factor = -1;
		next = nextToken();
	}
	//primary - expression
	if (!next.has_value()) {
		throw Error("Missing <primary-expression>", _currentLine);
	}
	std::int32_t index;
	std::string identifier;
	char type;
	switch (next.value().GetType())
	{
	case TokenType::LEFT_BRACKET:
		analyse_expression();
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
			throw Error("Missing ')'", _currentLine);
		}
		break;
	case TokenType::IDENTIFIER:
		identifier = std::any_cast<std::string>(next.value().GetValue());
		if (!loadVariable(identifier)) {
			type = getFunctionRetType(identifier);
			if (type == 'v') {
				throw Error("Can not call void function in < expression >", _currentLine);
			}
			unreadToken();
			analyse_function_call();
		}
		else {
			addInstruction(Instruction(Operation::iload));
		}
		break;
	case TokenType::UNSIGNED_INTEGER:
		index = addConstant(next.value());
		addInstruction(Instruction(Operation::loadc, index));
		break;
	default:
		throw Error("Missing <primary-expression>", _currentLine);
		break;
	}
	if (factor == -1) {
		addInstruction(Instruction(Operation::ineg));
	}
}